

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O2

void Fl::repeat_timeout(double time,Fl_Timeout_Handler cb,void *argp)

{
  Timeout *pTVar1;
  Timeout *pTVar2;
  Timeout **ppTVar3;
  double dVar4;
  
  dVar4 = (double)(~-(ulong)(time + missed_timeout_by < -0.05) & (ulong)(time + missed_timeout_by));
  if (free_timeout == (Timeout *)0x0) {
    pTVar2 = (Timeout *)operator_new(0x20);
  }
  else {
    pTVar2 = free_timeout;
    free_timeout = free_timeout->next;
  }
  pTVar2->time = dVar4;
  pTVar2->cb = cb;
  pTVar2->arg = argp;
  ppTVar3 = &first_timeout;
  while ((pTVar1 = *ppTVar3, pTVar1 != (Timeout *)0x0 && (pTVar1->time <= dVar4))) {
    ppTVar3 = &pTVar1->next;
  }
  pTVar2->next = pTVar1;
  *ppTVar3 = pTVar2;
  return;
}

Assistant:

void Fl::repeat_timeout(double time, Fl_Timeout_Handler cb, void *argp) {
  time += missed_timeout_by; if (time < -.05) time = 0;
  Timeout* t = free_timeout;
  if (t) {
      free_timeout = t->next;
  } else {
      t = new Timeout;
  }
  t->time = time;
  t->cb = cb;
  t->arg = argp;
  // insert-sort the new timeout:
  Timeout** p = &first_timeout;
  while (*p && (*p)->time <= time) p = &((*p)->next);
  t->next = *p;
  *p = t;
}